

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O3

bool __thiscall
jsoncons::typed_array_visitor<std::vector<double,_std::allocator<double>_>_>::visit_int64
          (typed_array_visitor<std::vector<double,_std::allocator<double>_>_> *this,int64_t value,
          semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  vector<double,_std::allocator<double>_> *this_00;
  iterator __position;
  double local_8;
  
  this_00 = this->v_;
  local_8 = (double)value;
  __position._M_current =
       (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (this_00,__position,&local_8);
  }
  else {
    *__position._M_current = local_8;
    (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_int64(int64_t value, 
            semantic_tag,
            const ser_context&,
            std::error_code&) override
        {
            v_.push_back(static_cast<value_type>(value));
            JSONCONS_VISITOR_RETURN;
        }